

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

int file_free(BIO *bio)

{
  if (bio->shutdown != 0) {
    if ((bio->init != 0) && ((FILE *)bio->ptr != (FILE *)0x0)) {
      fclose((FILE *)bio->ptr);
      bio->ptr = (void *)0x0;
    }
    bio->init = 0;
  }
  return 1;
}

Assistant:

static int file_free(BIO *bio) {
  if (!bio->shutdown) {
    return 1;
  }

  if (bio->init && bio->ptr != NULL) {
    fclose(reinterpret_cast<FILE *>(bio->ptr));
    bio->ptr = NULL;
  }
  bio->init = 0;

  return 1;
}